

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O2

int Bal_ManDeriveCuts(Bal_Man_t *p,int iFan0,int iFan1,int iFan2,int fCompl0,int fCompl1,int fCompl2
                     ,int fUnit0,int fUnit1,int fUnit2,int fIsXor,int Target,int fSave)

{
  Bal_Cut_t *pBVar1;
  Vec_Ptr_t *p_00;
  word wVar2;
  word wVar3;
  word wVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  word *pwVar11;
  word *pwVar12;
  int iVar13;
  ulong uVar14;
  Bal_Cut_t *pBVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int *piVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  word Sign;
  ulong uVar24;
  long lVar25;
  int i;
  uint uVar26;
  Bal_Cut_t *pBVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  int *piVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  Bal_Cut_t *pBVar36;
  Bal_Cut_t *pCutsR [8];
  Bal_Cut_t *pCutSet2;
  Bal_Cut_t *pCutSet1;
  Bal_Cut_t *local_180;
  Bal_Cut_t pCutSet [8];
  
  uVar14 = 0;
  iVar5 = Bal_ManPrepareSet(p,iFan0,0,fUnit0,&local_180);
  iVar6 = Bal_ManPrepareSet(p,iFan1,1,fUnit1,&pCutSet1);
  uVar8 = p->nCutNum;
  pBVar15 = pCutSet;
  memset(pBVar15,0,(long)(int)uVar8 * 0x28);
  uVar10 = 0;
  if (0 < (int)uVar8) {
    uVar10 = (ulong)uVar8;
  }
  for (; uVar10 != uVar14; uVar14 = uVar14 + 1) {
    pCutsR[uVar14] = pBVar15;
    pBVar15 = pBVar15 + 1;
  }
  if (iFan2 < 1) {
    piVar31 = local_180->pLeaves;
    uVar8 = 0;
    for (pBVar15 = local_180; pBVar27 = pCutSet1, pBVar15 < local_180 + iVar5; pBVar15 = pBVar15 + 1
        ) {
      for (; pBVar27 < pCutSet1 + iVar6; pBVar27 = pBVar27 + 1) {
        uVar10 = pBVar27->Sign | pBVar15->Sign;
        uVar10 = uVar10 - (uVar10 >> 1 & 0x5555555555555555);
        uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
        uVar17 = p->nLutSize;
        if ((int)(uint)(byte)(((uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                             0x38) <= (int)uVar17) {
          pBVar36 = pCutsR[(int)uVar8];
          uVar18 = *(uint *)&pBVar15->field_0xc >> 0x1b;
          uVar9 = *(uint *)&pBVar27->field_0xc >> 0x1b;
          if ((uVar18 == uVar17) && (uVar9 == uVar17)) {
            for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
              if (piVar31[uVar10] != pBVar27->pLeaves[uVar10]) goto LAB_005ae044;
              pBVar36->pLeaves[uVar10] = piVar31[uVar10];
            }
LAB_005adf37:
            *(uint *)&pBVar36->field_0xc = uVar17 << 0x1b | 0x7ffffff;
            pBVar36->Sign = pBVar27->Sign | pBVar15->Sign;
            iVar7 = pBVar27->Delay;
            if (pBVar27->Delay < pBVar15->Delay) {
              iVar7 = pBVar15->Delay;
            }
            pBVar36->Delay = iVar7;
            if (iVar7 != Target) {
              __assert_fail("pCutsR[nCutsR]->Delay == Target",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                            ,0x1bc,
                            "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                           );
            }
            iVar7 = Bal_SetLastCutIsContained(pCutsR,uVar8);
            if (iVar7 == 0) {
              uVar8 = Bal_SetAddCut(pCutsR,uVar8,p->nCutNum);
            }
          }
          else {
            iVar7 = 0;
            uVar10 = 0;
            lVar25 = 0;
            while( true ) {
              iVar20 = (int)uVar10;
              uVar23 = (uint)lVar25;
              lVar33 = 0;
              uVar21 = uVar23;
              while( true ) {
                uVar21 = uVar21 + 1;
                if ((ulong)uVar17 - lVar25 == lVar33) goto LAB_005ae044;
                iVar35 = piVar31[iVar20 + lVar33];
                iVar29 = pBVar27->pLeaves[iVar7];
                iVar13 = (int)lVar33;
                if (iVar29 <= iVar35) break;
                pBVar36->pLeaves[lVar25 + lVar33] = iVar35;
                lVar33 = lVar33 + 1;
                iVar35 = iVar7;
                if ((int)uVar18 <= (int)lVar33 + iVar20) goto LAB_005ae007;
              }
              if (iVar35 <= iVar29) break;
              pBVar36->pLeaves[lVar25 + lVar33] = iVar29;
              if ((int)uVar9 <= iVar7 + 1) {
                iVar20 = iVar20 + iVar13;
                goto LAB_005ae09a;
              }
              uVar10 = (ulong)(uint)(iVar20 + iVar13);
LAB_005adf23:
              iVar7 = iVar7 + 1;
              lVar25 = lVar25 + 1 + lVar33;
            }
            uVar10 = (uVar10 & 0xffffffff) + lVar33 + 1;
            pBVar36->pLeaves[lVar25 + lVar33] = iVar35;
            iVar35 = iVar7 + 1;
            if ((int)uVar10 < (int)uVar18) {
              if (iVar7 + 1 < (int)uVar9) goto LAB_005adf23;
              iVar20 = iVar20 + iVar13 + 1;
LAB_005ae09a:
              if ((int)(uVar18 + uVar23 + iVar13 + 1) <= (int)(uVar17 + iVar20)) {
                piVar19 = pBVar36->pLeaves + uVar21;
                uVar17 = uVar21;
                for (lVar25 = (long)iVar20; lVar25 < (long)(ulong)uVar18; lVar25 = lVar25 + 1) {
                  *piVar19 = piVar31[lVar25];
                  uVar17 = uVar17 + 1;
                  piVar19 = piVar19 + 1;
                }
                goto LAB_005adf37;
              }
            }
            else {
LAB_005ae007:
              if ((int)(uVar9 + uVar23 + iVar13 + 1) <= (int)(uVar17 + iVar35)) {
                piVar19 = pBVar36->pLeaves + uVar21;
                uVar17 = uVar21;
                for (lVar25 = (long)iVar35; lVar25 < (long)(ulong)uVar9; lVar25 = lVar25 + 1) {
                  *piVar19 = pBVar27->pLeaves[lVar25];
                  uVar17 = uVar17 + 1;
                  piVar19 = piVar19 + 1;
                }
                goto LAB_005adf37;
              }
            }
          }
        }
LAB_005ae044:
      }
      piVar31 = piVar31 + 10;
    }
  }
  else {
    iVar7 = Bal_ManPrepareSet(p,iFan2,2,fUnit2,&pCutSet2);
    uVar8 = 0;
    for (pBVar15 = local_180; pBVar27 = pCutSet1, pBVar15 < local_180 + iVar5; pBVar15 = pBVar15 + 1
        ) {
      for (; pBVar36 = pCutSet2, pBVar27 < pCutSet1 + iVar6; pBVar27 = pBVar27 + 1) {
        for (; pBVar36 < pCutSet2 + iVar7; pBVar36 = pBVar36 + 1) {
          uVar10 = pBVar27->Sign | pBVar15->Sign | pBVar36->Sign;
          uVar10 = uVar10 - (uVar10 >> 1 & 0x5555555555555555);
          uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
          uVar17 = p->nLutSize;
          if ((int)(uint)(byte)(((uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) <= (int)uVar17) {
            pBVar1 = pCutsR[(int)uVar8];
            uVar9 = *(uint *)&pBVar15->field_0xc;
            uVar18 = *(uint *)&pBVar27->field_0xc;
            uVar21 = *(uint *)&pBVar36->field_0xc;
            uVar10 = 0;
            iVar20 = 0x7ffffff;
            uVar23 = 0;
            uVar26 = 0;
            uVar32 = 0;
            while( true ) {
              iVar29 = 1000000000;
              iVar35 = 1000000000;
              if (uVar32 != uVar9 >> 0x1b) {
                iVar35 = pBVar15->pLeaves[uVar32];
              }
              if (uVar26 != uVar18 >> 0x1b) {
                iVar29 = pBVar27->pLeaves[uVar26];
              }
              iVar13 = 1000000000;
              if (uVar23 != uVar21 >> 0x1b) {
                iVar13 = pBVar36->pLeaves[uVar23];
              }
              iVar16 = iVar29;
              if (iVar35 < iVar29) {
                iVar16 = iVar35;
              }
              iVar30 = iVar13;
              if (iVar16 < iVar13) {
                iVar30 = iVar16;
              }
              if (iVar30 == 1000000000) break;
              if (uVar17 == uVar10) goto LAB_005add6e;
              pBVar1->pLeaves[uVar10] = iVar30;
              uVar10 = uVar10 + 1;
              uVar32 = uVar32 + (iVar35 == iVar30);
              uVar26 = uVar26 + (iVar29 == iVar30);
              uVar23 = uVar23 + (iVar13 <= iVar16);
              iVar20 = iVar20 + 0x8000000;
            }
            *(int *)&pBVar1->field_0xc = iVar20;
            pBVar1->Sign = pBVar27->Sign | pBVar15->Sign | pBVar36->Sign;
            iVar20 = pBVar36->Delay;
            if (pBVar36->Delay < pBVar27->Delay) {
              iVar20 = pBVar27->Delay;
            }
            if (iVar20 < pBVar15->Delay) {
              iVar20 = pBVar15->Delay;
            }
            pBVar1->Delay = iVar20;
            if (iVar20 != Target) {
              __assert_fail("pCutsR[nCutsR]->Delay == Target",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                            ,0x1ab,
                            "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                           );
            }
            iVar20 = Bal_SetLastCutIsContained(pCutsR,uVar8);
            if (iVar20 == 0) {
              uVar8 = Bal_SetAddCut(pCutsR,uVar8,p->nCutNum);
            }
          }
LAB_005add6e:
        }
      }
    }
  }
  if (uVar8 == 0) {
    uVar17 = 0xffffffff;
  }
  else {
    if (((int)uVar8 < 1) || (p->nCutNum <= (int)uVar8)) {
      __assert_fail("nCutsR > 0 && nCutsR < p->nCutNum",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                    ,0x1c9,
                    "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    uVar17 = *(uint *)&pCutsR[0]->field_0xc >> 0x1b | pCutsR[0]->Delay << 4;
    uVar14 = (ulong)uVar8;
    for (uVar10 = 0; uVar10 != uVar14; uVar10 = uVar10 + 1) {
      pBVar15 = pCutsR[uVar10];
      if (0x37ffffff < *(uint *)&pBVar15->field_0xc) {
        __assert_fail("pCut0->nLeaves <= BAL_LEAF_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                      ,0xc0,"int Bal_SetCheckArray(Bal_Cut_t **, int)");
      }
      uVar22 = (ulong)(*(uint *)&pBVar15->field_0xc >> 0x1b);
      uVar24 = 0;
      for (uVar28 = 0; uVar22 != uVar28; uVar28 = uVar28 + 1) {
        uVar24 = uVar24 | 1L << ((ulong)(byte)pBVar15->pLeaves[uVar28] & 0x3f);
      }
      if (pBVar15->Sign != uVar24) {
        __assert_fail("pCut0->Sign == Bal_CutGetSign(pCut0->pLeaves, pCut0->nLeaves)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                      ,0xc1,"int Bal_SetCheckArray(Bal_Cut_t **, int)");
      }
      piVar31 = pBVar15->pLeaves;
      lVar25 = 1;
      uVar24 = 0;
      while (piVar31 = piVar31 + 1, uVar24 != uVar22) {
        lVar33 = 0;
        while ((ulong)(lVar25 + lVar33) < uVar22) {
          piVar19 = piVar31 + lVar33;
          lVar33 = lVar33 + 1;
          if (*piVar19 <= pBVar15->pLeaves[uVar24]) {
            __assert_fail("pCut0->pLeaves[m] < pCut0->pLeaves[n]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                          ,0xc5,"int Bal_SetCheckArray(Bal_Cut_t **, int)");
          }
        }
        lVar25 = lVar25 + 1;
        uVar24 = uVar24 + 1;
      }
      for (uVar24 = 0; uVar24 != uVar14; uVar24 = uVar24 + 1) {
        pBVar27 = pCutsR[uVar24];
        if (pBVar15 != pBVar27) {
          uVar28 = 0;
          do {
            if (uVar28 == *(uint *)&pBVar27->field_0xc >> 0x1b) {
              __assert_fail("Value == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                            ,0xce,"int Bal_SetCheckArray(Bal_Cut_t **, int)");
            }
            uVar34 = 0;
            do {
              if (uVar22 == uVar34) goto LAB_005ae211;
              piVar31 = pBVar15->pLeaves + uVar34;
              uVar34 = uVar34 + 1;
            } while (pBVar27->pLeaves[uVar28] != *piVar31);
            uVar28 = uVar28 + 1;
          } while( true );
        }
LAB_005ae211:
      }
    }
    if ((fSave != 0) && (-1 < pCutsR[0]->Delay << 4)) {
      pwVar11 = (word *)calloc((long)p->nCutNum,0x28);
      p_00 = p->vCutSets;
      iVar5 = p_00->nSize;
      if (iVar5 == p_00->nCap) {
        iVar6 = 0x10;
        if (0xf < iVar5) {
          iVar6 = iVar5 * 2;
        }
        Vec_PtrGrow(p_00,iVar6);
        iVar5 = p_00->nSize;
      }
      p_00->nSize = iVar5 + 1;
      p_00->pArray[iVar5] = pwVar11;
      if (p->vCutSets->nSize != p->pNew->nObjs) {
        __assert_fail("Vec_PtrSize(p->vCutSets) == Gia_ManObjNum(p->pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                      ,0x1d0,
                      "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                     );
      }
      pwVar12 = pwVar11;
      for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
        pBVar15 = pCutsR[uVar10];
        pwVar12[4] = *(word *)(pBVar15->pLeaves + 4);
        wVar2 = pBVar15->Sign;
        wVar3 = *(word *)&pBVar15->Delay;
        wVar4 = *(word *)(pBVar15->pLeaves + 2);
        pwVar12[2] = *(word *)pBVar15->pLeaves;
        pwVar12[3] = wVar4;
        *pwVar12 = wVar2;
        pwVar12[1] = wVar3;
        pwVar12 = pwVar12 + 5;
      }
      iVar5 = p->nCutNum;
      lVar25 = (long)pwVar11 + uVar14 * 0x28 + 0xc;
      for (; (long)uVar14 < (long)iVar5; uVar14 = uVar14 + 1) {
        *(byte *)(lVar25 + 3) = *(byte *)(lVar25 + 3) | 0xf8;
        lVar25 = lVar25 + 0x28;
      }
      Vec_IntPush(p->vCosts,uVar17);
      if (p->vCosts->nSize != p->pNew->nObjs) {
        __assert_fail("Vec_IntSize(p->vCosts) == Gia_ManObjNum(p->pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                      ,0x1d6,
                      "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                     );
      }
    }
  }
  return uVar17;
}

Assistant:

int Bal_ManDeriveCuts( Bal_Man_t * p, int iFan0, int iFan1, int iFan2, int fCompl0, int fCompl1, int fCompl2, int fUnit0, int fUnit1, int fUnit2, int fIsXor, int Target, int fSave )
{
    Bal_Cut_t pCutSet[BAL_CUT_MAX], * pCutsR[BAL_CUT_MAX];
    Bal_Cut_t * pCutSet0, * pCutSet1, * pCutSet2;
    int nCuts0 = Bal_ManPrepareSet( p, iFan0, 0, fUnit0, &pCutSet0 );
    int nCuts1 = Bal_ManPrepareSet( p, iFan1, 1, fUnit1, &pCutSet1 );
    Bal_Cut_t * pCut0, * pCut0Lim = pCutSet0 + nCuts0;
    Bal_Cut_t * pCut1, * pCut1Lim = pCutSet1 + nCuts1;
    int i, Cost, nCutsR = 0;
    memset( pCutSet, 0, sizeof(Bal_Cut_t) * p->nCutNum );
    for ( i = 0; i < p->nCutNum; i++ )
        pCutsR[i] = pCutSet + i;
    // enumerate cuts
    if ( iFan2 > 0 )
    {
        int nCuts2 = Bal_ManPrepareSet( p, iFan2, 2, fUnit2, &pCutSet2 );
        Bal_Cut_t * pCut2, * pCut2Lim = pCutSet2 + nCuts2;
        for ( pCut0 = pCutSet0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCutSet1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCutSet2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Bal_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > p->nLutSize )
                continue;
            if ( !Bal_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], p->nLutSize) )
                continue;
            assert( pCutsR[nCutsR]->Delay == Target );
            if ( Bal_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
//            if ( p->fCutMin && Bal_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fCompl0, fCompl1, fCompl2, pCutsR[nCutsR]) )
//                pCutsR[nCutsR]->Sign = Bal_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            nCutsR = Bal_SetAddCut( pCutsR, nCutsR, p->nCutNum );
        }
    }
    else
    {
        for ( pCut0 = pCutSet0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCutSet1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( Bal_CutCountBits(pCut0->Sign | pCut1->Sign) > p->nLutSize )
                continue;
            if ( !Bal_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], p->nLutSize) )
                continue;
            assert( pCutsR[nCutsR]->Delay == Target );
            if ( Bal_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
//            if ( p->fCutMin && Bal_CutComputeTruth(p, pCut0, pCut1, fCompl0, fCompl1, pCutsR[nCutsR], fIsXor) )
//                pCutsR[nCutsR]->Sign = Bal_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            nCutsR = Bal_SetAddCut( pCutsR, nCutsR, p->nCutNum );
        }
    }
    if ( nCutsR == 0 )
        return -1;
//printf( "%d ", nCutsR );
    Cost = ((pCutsR[0]->Delay << 4) | pCutsR[0]->nLeaves);
    // verify
    assert( nCutsR > 0 && nCutsR < p->nCutNum );
    assert( Bal_SetCheckArray(pCutsR, nCutsR) );
    // save cuts
    if ( fSave && Cost >= 0 )
    {
        pCutSet0 = ABC_CALLOC( Bal_Cut_t, p->nCutNum );
        Vec_PtrPush( p->vCutSets, pCutSet0 );
        assert( Vec_PtrSize(p->vCutSets) == Gia_ManObjNum(p->pNew) );
        for ( i = 0; i < nCutsR; i++ )
            pCutSet0[i] = *pCutsR[i];        
        for ( ; i < p->nCutNum; i++ )
            pCutSet0[i].nLeaves = BAL_NO_LEAF;
        Vec_IntPush( p->vCosts, Cost );
        assert( Vec_IntSize(p->vCosts) == Gia_ManObjNum(p->pNew) );
    }
    return Cost;
}